

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O2

void __thiscall
slang::ast::WaitOrderStatement::serializeTo(WaitOrderStatement *this,ASTSerializer *serializer)

{
  pointer ppEVar1;
  size_t sVar2;
  size_t __n;
  long lVar3;
  string_view name;
  
  name._M_str = "events";
  name._M_len = 6;
  ASTSerializer::startArray(serializer,name);
  ppEVar1 = (this->events)._M_ptr;
  sVar2 = (this->events)._M_extent._M_extent_value;
  for (lVar3 = 0; sVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
    __n = *(size_t *)((long)ppEVar1 + lVar3);
    ASTSerializer::startObject(serializer);
    ASTSerializer::write(serializer,6,"target",__n);
    ASTSerializer::endObject(serializer);
  }
  ASTSerializer::endArray(serializer);
  if (this->ifTrue != (Statement *)0x0) {
    ASTSerializer::write(serializer,6,"ifTrue",(size_t)this->ifTrue);
  }
  if (this->ifFalse != (Statement *)0x0) {
    ASTSerializer::write(serializer,7,"ifFalse",(size_t)this->ifFalse);
    return;
  }
  return;
}

Assistant:

void WaitOrderStatement::serializeTo(ASTSerializer& serializer) const {
    serializer.startArray("events");
    for (auto ev : events) {
        serializer.startObject();
        serializer.write("target", *ev);
        serializer.endObject();
    }
    serializer.endArray();

    if (ifTrue)
        serializer.write("ifTrue", *ifTrue);
    if (ifFalse)
        serializer.write("ifFalse", *ifFalse);
}